

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Block::Frame::Read(Frame *this,IMkvReader *pReader,uchar *buf)

{
  int iVar1;
  
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1fa3,"long mkvparser::Block::Frame::Read(IMkvReader *, unsigned char *) const")
    ;
  }
  if (buf != (uchar *)0x0) {
    iVar1 = (**pReader->_vptr_IMkvReader)(pReader,this->pos,this->len,buf);
    return (long)iVar1;
  }
  __assert_fail("buf",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1fa4,"long mkvparser::Block::Frame::Read(IMkvReader *, unsigned char *) const");
}

Assistant:

long Block::Frame::Read(IMkvReader* pReader, unsigned char* buf) const {
  assert(pReader);
  assert(buf);

  const long status = pReader->Read(pos, len, buf);
  return status;
}